

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::add_into<signed_char>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  Alloc *pAVar1;
  int iVar2;
  int n;
  ulong uVar3;
  type f;
  
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar2 = (int)pAVar1->size;
  }
  else {
    iVar2 = (int)((ulong)pAVar1 >> 3);
  }
  n = (int)(uVar3 >> 2);
  if (n * width == iVar2) {
    Write<int>::Write((Write<int> *)&f,&a2b->write_);
    f.width = width;
    Write<signed_char>::Write(&f.b_data,b_data);
    Write<signed_char>::Write(&f.a_data.write_,&a_data->write_);
    parallel_for<Omega_h::add_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)::_lambda(int)_1_>
              (n,&f,"add_into");
    add_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)
    ::{lambda(int)#1}::~Write((_lambda_int__1_ *)&f);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0xf);
}

Assistant:

void add_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  auto na = a2b.size();
  OMEGA_H_CHECK(a_data.size() == na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] += a_data[a * width + j];
    }
  };
  parallel_for(na, f, "add_into");
}